

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

UChar32 icu_63::anon_unknown_10::utf16_caseContextIterator(void *context,int8_t dir)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (dir < '\0') {
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 0x14);
    *(int8_t *)((long)context + 0x1c) = dir;
LAB_002cf1e3:
    iVar3 = *(int *)((long)context + 0xc);
    if (iVar3 <= *(int *)((long)context + 8)) {
      return -1;
    }
    *(int *)((long)context + 0xc) = iVar3 + -1;
    uVar1 = *(ushort *)(*context + -2 + (long)iVar3 * 2);
    uVar4 = (uint)uVar1;
    if (iVar3 + -1 <= *(int *)((long)context + 8)) {
      return uVar4;
    }
    if ((uVar1 & 0xfc00) != 0xdc00) {
      return uVar4;
    }
    uVar1 = *(ushort *)(*context + -4 + (long)iVar3 * 2);
    if ((uVar1 & 0xfc00) != 0xd800) {
      return uVar4;
    }
    *(int *)((long)context + 0xc) = iVar3 + -2;
    uVar5 = (uint)uVar1 << 10;
  }
  else {
    if (dir == '\0') {
      if (*(char *)((long)context + 0x1c) < '\0') goto LAB_002cf1e3;
    }
    else {
      *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 0x18);
      *(int8_t *)((long)context + 0x1c) = dir;
    }
    iVar3 = *(int *)((long)context + 0xc);
    if (*(int *)((long)context + 0x10) <= iVar3) {
      return -1;
    }
    *(int *)((long)context + 0xc) = iVar3 + 1;
    uVar1 = *(ushort *)(*context + (long)iVar3 * 2);
    uVar4 = (uint)uVar1;
    if ((uVar1 & 0xfc00) != 0xd800) {
      return uVar4;
    }
    if (iVar3 + 1 == *(int *)((long)context + 0x10)) {
      return uVar4;
    }
    uVar2 = *(ushort *)(*context + 2 + (long)iVar3 * 2);
    uVar5 = (uint)uVar2;
    if ((uVar2 & 0xfc00) != 0xdc00) {
      return uVar4;
    }
    *(int *)((long)context + 0xc) = iVar3 + 2;
    uVar4 = (uint)uVar1 << 10;
  }
  return uVar4 + uVar5 + -0x35fdc00;
}

Assistant:

UChar32 U_CALLCONV
utf16_caseContextIterator(void *context, int8_t dir) {
    UCaseContext *csc=(UCaseContext *)context;
    UChar32 c;

    if(dir<0) {
        /* reset for backward iteration */
        csc->index=csc->cpStart;
        csc->dir=dir;
    } else if(dir>0) {
        /* reset for forward iteration */
        csc->index=csc->cpLimit;
        csc->dir=dir;
    } else {
        /* continue current iteration direction */
        dir=csc->dir;
    }

    if(dir<0) {
        if(csc->start<csc->index) {
            U16_PREV((const UChar *)csc->p, csc->start, csc->index, c);
            return c;
        }
    } else {
        if(csc->index<csc->limit) {
            U16_NEXT((const UChar *)csc->p, csc->index, csc->limit, c);
            return c;
        }
    }
    return U_SENTINEL;
}